

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O0

Fl_Double_Window * make_code_panel(void)

{
  CodeEditor *this;
  Fl_Fontsize val;
  Fl_Window *this_00;
  Fl_Widget *pFVar1;
  Fl_Group *pFVar2;
  Fl_Window *this_01;
  Fl_Button *this_02;
  Fl_Group *this_03;
  Fl_Box *o_3;
  Fl_Group *o_2;
  CodeEditor *o_1;
  Fl_Double_Window *o;
  
  this_00 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this_00,0x21c,0xb4,"Code Properties");
  code_panel = (Fl_Double_Window *)this_00;
  Fl_Widget::labelsize((Fl_Widget *)this_00,0xb);
  Fl_Widget::callback((Fl_Widget *)code_panel,cb_code_panel);
  pFVar1 = (Fl_Widget *)operator_new(0x1c0);
  CodeEditor::CodeEditor((CodeEditor *)pFVar1,10,10,0x208,0x82,(char *)0x0);
  code_input = (CodeEditor *)pFVar1;
  Fl_Widget::box(pFVar1,FL_DOWN_BOX);
  Fl_Widget::color((Fl_Widget *)code_input,7);
  Fl_Widget::selection_color((Fl_Widget *)code_input,0xf);
  Fl_Widget::labeltype((Fl_Widget *)code_input,FL_NORMAL_LABEL);
  Fl_Widget::labelfont((Fl_Widget *)code_input,0);
  Fl_Widget::labelsize((Fl_Widget *)code_input,0xb);
  Fl_Widget::labelcolor((Fl_Widget *)code_input,0);
  Fl_Text_Display::textfont((Fl_Text_Display *)code_input,4);
  CodeEditor::textsize(code_input,0xb);
  Fl_Widget::align((Fl_Widget *)code_input,1);
  Fl_Widget::when((Fl_Widget *)code_input,'\x04');
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)code_input);
  Fl_Widget::when(pFVar1,'\x0f');
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0x96,0x208,0x14,(char *)0x0);
  Fl_Widget::labelsize((Fl_Widget *)pFVar2,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar1,400,0x96,0x3c,0x14,"OK");
  code_panel_ok = (Fl_Return_Button *)pFVar1;
  Fl_Widget::labelsize(pFVar1,0xb);
  this_01 = Fl_Widget::window((Fl_Widget *)code_panel_ok);
  Fl_Window::hotspot(this_01,(Fl_Widget *)code_panel_ok,0);
  this_02 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_02,0x1d6,0x96,0x3c,0x14,"Cancel");
  code_panel_cancel = this_02;
  Fl_Widget::labelsize((Fl_Widget *)this_02,0xb);
  pFVar1 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar1,10,0x96,0x17c,0x14,(char *)0x0);
  Fl_Widget::labelsize(pFVar1,0xb);
  this_03 = Fl_Group::current();
  Fl_Group::resizable(this_03,pFVar1);
  Fl_Group::end(pFVar2);
  Fl_Window::size_range(this_00,200,0x96,0,0,0,0,0);
  Fl_Window::set_modal(&code_panel->super_Fl_Window);
  Fl_Group::end((Fl_Group *)code_panel);
  Fl_Text_Display::linenumber_width((Fl_Text_Display *)code_input,0x3c);
  this = code_input;
  val = Fl_Text_Display::textsize((Fl_Text_Display *)code_input);
  Fl_Text_Display::linenumber_size((Fl_Text_Display *)this,val);
  return code_panel;
}

Assistant:

Fl_Double_Window* make_code_panel() {
  { Fl_Double_Window* o = code_panel = new Fl_Double_Window(540, 180, "Code Properties");
    code_panel->labelsize(11);
    code_panel->callback((Fl_Callback*)cb_code_panel);
    { CodeEditor* o = code_input = new CodeEditor(10, 10, 520, 130);
      code_input->box(FL_DOWN_BOX);
      code_input->color(FL_BACKGROUND2_COLOR);
      code_input->selection_color(FL_SELECTION_COLOR);
      code_input->labeltype(FL_NORMAL_LABEL);
      code_input->labelfont(0);
      code_input->labelsize(11);
      code_input->labelcolor(FL_FOREGROUND_COLOR);
      code_input->textfont(4);
      code_input->textsize(11);
      code_input->align(Fl_Align(FL_ALIGN_TOP));
      code_input->when(FL_WHEN_RELEASE);
      Fl_Group::current()->resizable(code_input);
      o->when(FL_WHEN_ENTER_KEY_CHANGED|FL_WHEN_RELEASE);
    } // CodeEditor* code_input
    { Fl_Group* o = new Fl_Group(10, 150, 520, 20);
      o->labelsize(11);
      { code_panel_ok = new Fl_Return_Button(400, 150, 60, 20, "OK");
        code_panel_ok->labelsize(11);
        code_panel_ok->window()->hotspot(code_panel_ok);
      } // Fl_Return_Button* code_panel_ok
      { code_panel_cancel = new Fl_Button(470, 150, 60, 20, "Cancel");
        code_panel_cancel->labelsize(11);
      } // Fl_Button* code_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 150, 380, 20);
        o->labelsize(11);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(200, 150);
    code_panel->set_modal();
    code_panel->end();
  } // Fl_Double_Window* code_panel
  // Enable line numbers
  code_input->linenumber_width(60);
  code_input->linenumber_size(code_input->Fl_Text_Display::textsize());
  return code_panel;
}